

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell::createTest
          (TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x185);
  TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test::
  TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test
            ((TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_InitialMatchDiscarded)
{
    void* objectPtr1 = (void*) 0x001;
    void* objectPtr2 = (void*) 0x002;

    mock().expectOneCall("boo");
    mock().expectOneCall("boo").withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr2).withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr1);
}